

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::standard_value<bool>::set_default_and_implicit(standard_value<bool> *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x30) = 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x38),"false");
  *(undefined1 *)(in_RDI + 0x31) = 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x58),"true");
  return;
}

Assistant:

void
            set_default_and_implicit()
            {
                m_default = true;
                m_default_value = "false";
                m_implicit = true;
                m_implicit_value = "true";
            }